

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::fboc::details::TestBase::iterate(TestBase *this)

{
  FormatDB *db;
  FormatDB *db_00;
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  ostringstream *poVar3;
  Context *pCVar4;
  TestLog *log;
  bool bVar5;
  int iVar6;
  IterateResult IVar7;
  GLenum fboStatus;
  undefined4 extraout_var;
  ObjectTraits *traits;
  undefined4 extraout_var_00;
  _Base_ptr p_Var8;
  size_t sVar9;
  undefined4 extraout_var_01;
  long *plVar10;
  long *plVar11;
  char *pcVar12;
  long lVar13;
  FormatDB *db_01;
  qpTestResult qVar14;
  char *pcVar15;
  MessageBuilder *in_R8;
  FormatFlags feature;
  FormatFlags feature_00;
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  formats;
  ScopedLogSection section;
  ScopedLogSection supersection;
  MessageBuilder msg;
  ValidStatusCodes reference;
  Framebuffer fbo;
  FboBuilder builder;
  string local_370;
  FormatDB *local_350;
  IterateResult local_344;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_340;
  ScopedLogSection local_310;
  ScopedLogSection local_308;
  string local_300;
  TestBase *local_2e0;
  _Rb_tree_node_base *local_2d8;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [6];
  ios_base local_260 [8];
  ios_base local_258 [264];
  ValidStatusCodes local_150;
  ObjectWrapper local_118;
  FboBuilder local_100;
  
  iVar6 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_118,(Functions *)CONCAT44(extraout_var,iVar6),traits);
  iVar6 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
  FboUtil::FboBuilder::FboBuilder
            (&local_100,local_118.m_object,0x8d40,(Functions *)CONCAT44(extraout_var_00,iVar6));
  IVar7 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&local_100);
  FboUtil::FboVerifier::validStatusCodes
            (&local_150,&this->m_ctx->m_verifier,&local_100.super_Framebuffer);
  FboUtil::logFramebufferConfig
            (&local_100.super_Framebuffer,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  pCVar4 = this->m_ctx;
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_340._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_340._M_impl.super__Rb_tree_header._M_header;
  local_340._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)local_340._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_340._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_100.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header;
  local_340._M_impl.super__Rb_tree_header._M_header._M_right =
       local_340._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)
      local_100.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var2) {
    p_Var8 = local_100.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    do {
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
      ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
                ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
                  *)&local_340,(ImageFormat *)&(p_Var8[1]._M_parent)->_M_parent);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var2);
  }
  p_Var2 = &local_100.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)
      local_100.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var2) {
    p_Var8 = local_100.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
      ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
                ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
                  *)&local_340,(ImageFormat *)&(p_Var8[1]._M_parent)->_M_parent);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var2);
  }
  if (local_340._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_2c0[0]._M_allocated_capacity._0_4_ = 0x6d726f46;
    local_2c0[0]._M_allocated_capacity._4_2_ = 0x7461;
    local_2d0._8_8_ = 6;
    local_2c0[0]._M_local_buf[6] = '\0';
    local_370.field_2._M_allocated_capacity._0_7_ = 0x2074616d726f46;
    local_370.field_2._M_local_buf[7] = 'i';
    local_370.field_2._8_2_ = 0x666e;
    local_370.field_2._M_local_buf[10] = 'o';
    local_370._M_string_length = 0xb;
    local_370.field_2._M_local_buf[0xb] = '\0';
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    local_2d0._0_8_ = (TestLog *)(local_2d0 + 0x10);
    tcu::ScopedLogSection::ScopedLogSection(&local_308,log,(string *)local_2d0,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,
                      CONCAT17(local_370.field_2._M_local_buf[7],
                               local_370.field_2._M_allocated_capacity._0_7_) + 1);
    }
    local_344 = IVar7;
    local_2e0 = this;
    if ((TestLog *)local_2d0._0_8_ != (TestLog *)(local_2d0 + 0x10)) {
      operator_delete((void *)local_2d0._0_8_,
                      CONCAT17(local_2c0[0]._M_local_buf[7],
                               CONCAT16(local_2c0[0]._M_local_buf[6],
                                        CONCAT24(local_2c0[0]._M_allocated_capacity._4_2_,
                                                 (undefined4)local_2c0[0]._M_allocated_capacity))) +
                      1);
    }
    if ((_Rb_tree_header *)local_340._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_340._M_impl.super__Rb_tree_header) {
      db = &pCVar4->m_ctxFormats;
      local_350 = &pCVar4->m_coreFormats;
      db_01 = &pCVar4->m_allFormats;
      poVar3 = (ostringstream *)(local_2d0 + 8);
      p_Var8 = local_340._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        local_370.field_2._M_allocated_capacity._0_7_ = 0x4974616d726f46;
        local_370.field_2._M_local_buf[7] = 'n';
        local_370.field_2._8_2_ = 0x6f66;
        local_370._M_string_length = 10;
        local_370.field_2._M_local_buf[10] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
        db_00 = (FormatDB *)(p_Var8 + 1);
        FboUtil::operator<<((ostream *)local_2d0,(ImageFormat *)db_00);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
        std::ios_base::~ios_base(local_260);
        tcu::ScopedLogSection::ScopedLogSection(&local_310,log,&local_370,&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT17(local_370.field_2._M_local_buf[7],
                                   local_370.field_2._M_allocated_capacity._0_7_) + 1);
        }
        bVar5 = isFormatFeatureSupported(db,(ImageFormat *)db_00,TEXTURE_VALID);
        local_2d0._0_8_ = log;
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2d0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2d0 + 8),"* Valid texture format\n",0x17);
          bVar5 = isFormatFeatureSupported(local_350,(ImageFormat *)db_00,TEXTURE_VALID);
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2d0 + 8),"\t* core feature",0xf);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2d0 + 8),"\t* defined in supported extension(s):\n",0x26);
            logAffectingExtensions
                      ((char *)db,db_00,(ImageFormat *)0x10,(FormatFlags)local_2d0,in_R8);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2d0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2d0 + 8),"* Unsupported texture format\n",0x1d);
          bVar5 = isFormatFeatureSupported(db_01,(ImageFormat *)db_00,TEXTURE_VALID);
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2d0 + 8),
                       "\t* requires any of the extensions or combinations:\n",0x33);
            logAffectingExtensions
                      ((char *)db_01,db_00,(ImageFormat *)0x10,(FormatFlags)local_2d0,in_R8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2d0 + 8),"\t* no extension can make this format valid",0x2a
                      );
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2d0 + 8));
        std::ios_base::~ios_base(local_258);
        bVar5 = isFormatFeatureSupported(db,(ImageFormat *)db_00,RENDERBUFFER_VALID);
        local_2d8 = p_Var8;
        if (bVar5) {
          local_2d0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"* Valid renderbuffer format\n",0x1c);
          bVar5 = isFormatFeatureSupported(local_350,(ImageFormat *)db_00,RENDERBUFFER_VALID);
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"\t* core feature",0xf);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"\t* defined in supported extension(s):\n",0x26);
            logAffectingExtensions((char *)db,db_00,(ImageFormat *)0x8,(FormatFlags)local_2d0,in_R8)
            ;
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_2d0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2d0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2d0 + 8),"* Unsupported renderbuffer format\n",0x22);
          bVar5 = isFormatFeatureSupported(db_01,(ImageFormat *)db_00,RENDERBUFFER_VALID);
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2d0 + 8),
                       "\t* requires any of the extensions or combinations:\n",0x33);
            logAffectingExtensions
                      ((char *)db_01,db_00,(ImageFormat *)0x8,(FormatFlags)local_2d0,in_R8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2d0 + 8),"\t* no extension can make this format valid",0x2a
                      );
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2d0 + 8));
        std::ios_base::~ios_base(local_258);
        lVar13 = 0;
        do {
          feature_00 = *(FormatFlags *)(&DAT_00d54298 + lVar13);
          feature = feature_00 | REQUIRED_RENDERABLE;
          bVar5 = isFormatFeatureSupported(db,(ImageFormat *)db_00,feature);
          iVar6 = (int)poVar3;
          if (bVar5) {
            local_2d0._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"* Format is ",0xc)
            ;
            pcVar12 = *(char **)((long)&logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                                        ::s_renderability + lVar13);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
            }
            else {
              sVar9 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar12,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
            bVar5 = isFormatFeatureSupported(local_350,(ImageFormat *)db_00,feature);
            if (bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\t* core feature",0xf);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\t* defined in supported extension(s):\n",0x26);
              logAffectingExtensions
                        ((char *)db,db_00,(ImageFormat *)(ulong)feature,(FormatFlags)local_2d0,in_R8
                        );
            }
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            bVar5 = isFormatFeatureSupported(db,(ImageFormat *)db_00,feature_00);
            if (bVar5) {
              local_2d0._0_8_ = log;
              std::__cxx11::ostringstream::ostringstream(poVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"* Format is allowed to be ",0x1a);
              pcVar12 = *(char **)((long)&logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                                          ::s_renderability + lVar13);
              if (pcVar12 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
              }
              else {
                sVar9 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar12,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3," but not required\n",0x12);
              bVar5 = isFormatFeatureSupported(local_350,(ImageFormat *)db_00,feature_00);
              sVar9 = 0xf;
              pcVar15 = "\t* core feature";
              if (bVar5) {
LAB_008f493e:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar15,sVar9);
              }
              else {
                bVar5 = isFormatFeatureSupported(db_01,(ImageFormat *)db_00,feature_00);
                if (bVar5) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar3,"\t* extensions that would make format ",0x25);
                  if (pcVar12 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
                  }
                  else {
                    sVar9 = strlen(pcVar12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar3,pcVar12,sVar9);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,":\n",2);
                  logAffectingExtensions
                            ((char *)db_01,db_00,(ImageFormat *)(ulong)feature_00,
                             (FormatFlags)local_2d0,in_R8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar3,"\t* no extension can make this format ",0x25);
                  if (pcVar12 != (char *)0x0) {
                    sVar9 = strlen(pcVar12);
                    pcVar15 = pcVar12;
                    goto LAB_008f493e;
                  }
                  std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
                }
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            else {
              local_2d0._0_8_ = log;
              std::__cxx11::ostringstream::ostringstream(poVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"* Format is NOT ",0x10);
              pcVar12 = *(char **)((long)&logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                                          ::s_renderability + lVar13);
              if (pcVar12 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
              }
              else {
                sVar9 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar12,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              bVar5 = isFormatFeatureSupported(db_01,(ImageFormat *)db_00,feature_00);
              if (bVar5) {
                bVar5 = isFormatFeatureSupported(db_01,(ImageFormat *)db_00,feature);
                if (bVar5) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar3,"\t* extensions that would make format ",0x25);
                  if (pcVar12 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
                  }
                  else {
                    sVar9 = strlen(pcVar12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar3,pcVar12,sVar9);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,":\n",2);
                  feature_00 = feature;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar3,"\t* extensions that are allowed to make format ",
                             0x2e);
                  if (pcVar12 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
                  }
                  else {
                    sVar9 = strlen(pcVar12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar3,pcVar12,sVar9);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,":\n",2);
                }
                logAffectingExtensions
                          ((char *)db_01,db_00,(ImageFormat *)(ulong)feature_00,
                           (FormatFlags)local_2d0,in_R8);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar3,"\t* no extension can make this format ",0x25);
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(local_2d0._8_8_ - 0x18) + iVar6);
                }
                else {
                  sVar9 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar3,pcVar12,sVar9);
                }
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
          }
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_258);
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x30);
        tcu::TestLog::endSection(local_310.m_log);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_2d8);
      } while ((_Rb_tree_header *)p_Var8 != &local_340._M_impl.super__Rb_tree_header);
    }
    tcu::TestLog::endSection(local_308.m_log);
    this = local_2e0;
    IVar7 = local_344;
  }
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&local_340);
  FboUtil::ValidStatusCodes::logRules
            (&local_150,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  FboUtil::ValidStatusCodes::logLegalResults
            (&local_150,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  if (local_100.m_error != 0) {
    local_2d0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_2d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Received ",9);
    local_340._M_impl._0_8_ = glu::getErrorName;
    local_340._M_impl.super__Rb_tree_header._M_header._M_color = local_100.m_error;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_340,(ostream *)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3," (during FBO initialization).",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_258);
    bVar5 = FboUtil::ValidStatusCodes::isErrorCodeValid(&local_150,local_100.m_error);
    if (bVar5) {
      pcVar12 = "Pass";
      qVar14 = QP_TEST_RESULT_PASS;
    }
    else {
      bVar5 = FboUtil::ValidStatusCodes::isErrorCodeRequired(&local_150,0);
      if (bVar5) {
        local_300._M_dataplus._M_p = (pointer)glu::getErrorName;
        local_300._M_string_length._0_4_ = local_100.m_error;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_300,(ostream *)local_2d0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
        std::ios_base::~ios_base(local_260);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,0xb7a647);
        pp_Var1 = &local_340._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar11 = plVar10 + 2;
        if ((_Base_ptr *)*plVar10 == (_Base_ptr *)plVar11) {
          local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar11;
          local_340._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar10[3];
          local_340._M_impl._0_8_ = pp_Var1;
        }
        else {
          local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar11;
          local_340._M_impl._0_8_ = (_Base_ptr *)*plVar10;
        }
        local_340._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar10[1];
        *plVar10 = (long)plVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   (char *)local_340._M_impl._0_8_);
        if ((_Base_ptr *)local_340._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_340._M_impl._0_8_,
                          (ulong)((long)&(local_340._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          CONCAT17(local_370.field_2._M_local_buf[7],
                                   local_370.field_2._M_allocated_capacity._0_7_) + 1);
        }
        goto LAB_008f4ebb;
      }
      pcVar12 = "Got wrong error code";
      qVar14 = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult((this->super_TestCase).super_TestNode.m_testCtx,qVar14,pcVar12);
    goto LAB_008f4ebb;
  }
  iVar6 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
  fboStatus = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x170))(0x8d40);
  bVar5 = FboUtil::ValidStatusCodes::isFBOStatusValid(&local_150,fboStatus);
  local_2d0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_2d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Received ",9);
  local_340._M_impl._0_8_ = glu::getFramebufferStatusName;
  local_340._M_impl.super__Rb_tree_header._M_header._M_color = fboStatus;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_340,(ostream *)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_258);
  if (bVar5) {
    if (fboStatus != 0x8cd5) {
      bVar5 = FboUtil::ValidStatusCodes::isFBOStatusValid(&local_150,0x8cd5);
      if (bVar5) {
        pcVar12 = "Framebuffer object could have checked as complete but did not.";
        qVar14 = QP_TEST_RESULT_QUALITY_WARNING;
        goto LAB_008f4e4a;
      }
    }
    pcVar12 = "Pass";
    qVar14 = QP_TEST_RESULT_PASS;
  }
  else {
    qVar14 = QP_TEST_RESULT_FAIL;
    if (fboStatus == 0x8cd5) {
      pcVar12 = "Framebuffer checked as complete, expected incomplete";
    }
    else {
      bVar5 = FboUtil::ValidStatusCodes::isFBOStatusRequired(&local_150,0x8cd5);
      pcVar12 = "Framebuffer checked as incomplete, but with wrong status";
      if (bVar5) {
        pcVar12 = "Framebuffer checked is incomplete, expected complete";
      }
    }
  }
LAB_008f4e4a:
  tcu::TestContext::setTestResult((this->super_TestCase).super_TestNode.m_testCtx,qVar14,pcVar12);
LAB_008f4ebb:
  std::
  vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
  ::~vector(&local_150.m_errorStatuses);
  std::
  vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
  ::~vector(&local_150.m_errorCodes);
  FboUtil::FboBuilder::~FboBuilder(&local_100);
  glu::ObjectWrapper::~ObjectWrapper(&local_118);
  return IVar7;
}

Assistant:

IterateResult TestBase::iterate (void)
{
	glu::Framebuffer		fbo			(m_ctx.getRenderContext());
	FboBuilder				builder		(*fbo, GL_FRAMEBUFFER, gl(*this));
	const IterateResult		ret			= build(builder);
	const ValidStatusCodes	reference	= m_ctx.getVerifier().validStatusCodes(builder);
	const GLenum			errorCode	= builder.getError();

	logFramebufferConfig(builder, m_testCtx.getLog());
	logFormatInfo(builder, m_ctx.getCtxFormats(), m_ctx.getCoreFormats(), m_ctx.getAllFormats(), m_testCtx.getLog());
	reference.logRules(m_testCtx.getLog());
	reference.logLegalResults(m_testCtx.getLog());

	// \todo [2013-12-04 lauri] Check if drawing operations succeed.

	if (errorCode != GL_NO_ERROR)
	{
		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getErrorStr(errorCode) << " (during FBO initialization)."
			<< TestLog::EndMessage;

		if (reference.isErrorCodeValid(errorCode))
			pass();
		else if (reference.isErrorCodeRequired(GL_NO_ERROR))
			fail(("Expected no error but got " + de::toString(glu::getErrorStr(errorCode))).c_str());
		else
			fail("Got wrong error code");
	}
	else
	{
		const GLenum	fboStatus	= gl(*this).checkFramebufferStatus(GL_FRAMEBUFFER);
		const bool		validStatus	= reference.isFBOStatusValid(fboStatus);

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getFramebufferStatusStr(fboStatus) << "."
			<< TestLog::EndMessage;

		if (!validStatus)
		{
			if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
				fail("Framebuffer checked as complete, expected incomplete");
			else if (reference.isFBOStatusRequired(GL_FRAMEBUFFER_COMPLETE))
				fail("Framebuffer checked is incomplete, expected complete");
			else
				// An incomplete status is allowed, but not _this_ incomplete status.
				fail("Framebuffer checked as incomplete, but with wrong status");
		}
		else if (fboStatus != GL_FRAMEBUFFER_COMPLETE && reference.isFBOStatusValid(GL_FRAMEBUFFER_COMPLETE))
			qualityWarning("Framebuffer object could have checked as complete but did not.");
		else
			pass();
	}

	return ret;
}